

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCMPrint.cpp
# Opt level: O0

void processComplexTypeDefinition(XSComplexTypeDefinition *xsComplexTypeDef)

{
  int iVar1;
  XMLCh *toTranscode;
  ostream *poVar2;
  XSParticle *xsParticle;
  CONTENT_TYPE contentType;
  StrX local_20;
  long *local_18;
  XSTypeDefinition *xsBaseTypeDef;
  XSComplexTypeDefinition *xsComplexTypeDef_local;
  
  xsBaseTypeDef = (XSTypeDefinition *)xsComplexTypeDef;
  local_18 = (long *)(**(code **)(*(long *)xsComplexTypeDef + 0x30))();
  if (local_18 != (long *)0x0) {
    std::operator<<((ostream *)&std::cout,"Base:\t\t\t");
    toTranscode = (XMLCh *)(**(code **)(*local_18 + 0x10))();
    StrX::StrX(&local_20,toTranscode);
    poVar2 = operator<<((ostream *)&std::cout,&local_20);
    std::operator<<(poVar2,"\n");
    StrX::~StrX(&local_20);
  }
  std::operator<<((ostream *)&std::cout,"Content Model:\t");
  iVar1 = xercesc_4_0::XSComplexTypeDefinition::getContentType();
  if ((iVar1 == 2) || (iVar1 == 3)) {
    xsParticle = xercesc_4_0::XSComplexTypeDefinition::getParticle
                           ((XSComplexTypeDefinition *)xsBaseTypeDef);
    processParticle(xsParticle);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void processComplexTypeDefinition(XSComplexTypeDefinition *xsComplexTypeDef)
{
    XSTypeDefinition *xsBaseTypeDef = xsComplexTypeDef->getBaseType();
    if (xsBaseTypeDef) {
        std::cout << "Base:\t\t\t";
        std::cout << StrX(xsBaseTypeDef->getName()) << "\n";
    }

    std::cout << "Content Model:\t";
    XSComplexTypeDefinition::CONTENT_TYPE contentType = xsComplexTypeDef->getContentType();
    if (contentType == XSComplexTypeDefinition::CONTENTTYPE_ELEMENT ||
        contentType == XSComplexTypeDefinition::CONTENTTYPE_MIXED) {
        processParticle(xsComplexTypeDef->getParticle());
        std::cout << std::endl;
    }
}